

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O3

VTable * __thiscall
flatbuffers::BinaryAnnotator::GetOrBuildVTable
          (BinaryAnnotator *this,uint64_t vtable_offset,Object *table,
          uint64_t offset_of_referring_table)

{
  ushort uVar1;
  _List_node_base *p_Var2;
  ulong uVar3;
  BinaryAnnotator *pBVar4;
  uint64_t offset;
  bool bVar5;
  uint uVar6;
  _List_node_base *__position;
  mapped_type *pmVar7;
  uint uVar8;
  int iVar9;
  undefined2 uVar10;
  short sVar11;
  _List_node_base *p_Var12;
  uint64_t uVar13;
  VTable *pVVar14;
  ulong offset_00;
  ulong uVar15;
  undefined8 uVar16;
  long *plVar17;
  _Alloc_hider _Var18;
  long *plVar19;
  ulong uVar20;
  iterator __end1;
  uint16_t vtable_size;
  uint16_t fields_processed;
  string referring_table_name;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  uint64_t offset_start;
  map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  fields;
  ushort local_7bc;
  ushort local_7ba;
  BinaryAnnotator *local_7b8;
  uint64_t local_7b0;
  undefined1 local_7a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_798;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_788;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_780;
  _Alloc_hider local_778;
  undefined4 local_770;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_768;
  _Alloc_hider local_750;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_740;
  _Alloc_hider local_730;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_720;
  string local_708;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_6e8;
  int local_6cc;
  undefined1 local_6c8 [8];
  char *local_6c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6b8;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_6a0;
  undefined1 local_688 [24];
  uint64_t local_670;
  undefined1 local_668;
  undefined7 uStack_667;
  _Alloc_hider local_658;
  undefined1 local_650 [8];
  undefined1 local_648 [16];
  undefined1 local_638 [16];
  undefined1 local_628 [24];
  undefined1 local_610;
  undefined7 uStack_60f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_600;
  undefined1 local_5f0;
  undefined7 uStack_5ef;
  ulong local_5e0;
  BinaryRegionStatus local_5d8;
  undefined1 *local_5d0;
  long local_5c8;
  undefined1 local_5c0;
  undefined7 uStack_5bf;
  BinaryRegionCommentType local_5b0;
  undefined1 *local_5a8;
  long local_5a0;
  undefined1 local_598;
  undefined7 uStack_597;
  undefined1 *local_588;
  long local_580;
  undefined1 local_578;
  undefined7 uStack_577;
  size_t local_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_560;
  long local_558;
  uint64_t local_550;
  undefined1 local_548 [16];
  _Base_ptr local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_520;
  size_type *local_518 [2];
  size_type local_508 [2];
  ulong local_4f8;
  ulong local_4f0;
  undefined1 local_4e8 [8];
  _Alloc_hider local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  BinaryRegionCommentType local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  _Alloc_hider local_498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  ulong local_478;
  undefined1 local_470 [8];
  _Alloc_hider local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  BinaryRegionCommentType local_448;
  _Alloc_hider local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  _Alloc_hider local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  ulong local_400;
  _Any_data local_3f8;
  code *local_3e8;
  code *pcStack_3e0;
  long *local_3d8 [2];
  long local_3c8 [2];
  long *local_3b8 [2];
  long local_3a8 [2];
  long *local_398 [2];
  long local_388 [2];
  long *local_378 [2];
  long local_368 [2];
  long *local_358 [2];
  long local_348 [2];
  long *local_338 [2];
  long local_328 [2];
  undefined1 local_318 [8];
  _Alloc_hider local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  BinaryRegionCommentType local_2f0;
  _Alloc_hider local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  _Alloc_hider local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  pointer local_2a8;
  undefined1 local_2a0 [8];
  _Alloc_hider local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  BinaryRegionCommentType local_278;
  _Alloc_hider local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Alloc_hider local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  size_t local_230;
  undefined1 local_228 [8];
  _Alloc_hider local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  BinaryRegionCommentType local_200;
  _Alloc_hider local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Alloc_hider local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  pointer local_1b8;
  undefined1 local_1b0 [8];
  _Alloc_hider local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  BinaryRegionCommentType local_188;
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  _Alloc_hider local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  size_t local_140;
  undefined1 local_138 [8];
  _Alloc_hider local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  BinaryRegionCommentType local_110;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  size_t local_c8;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  BinaryRegionCommentType local_98;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  size_t local_50;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_48;
  
  local_7b0 = vtable_offset;
  local_550 = offset_of_referring_table;
  __position = (_List_node_base *)
               std::
               map<unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>_>_>_>
               ::operator[](&this->vtables_,&local_7b0);
  p_Var2 = __position->_M_next;
  p_Var12 = p_Var2;
  if (p_Var2 == __position) {
LAB_00308492:
    bVar5 = ContainsSection(this,local_7b0);
    if (bVar5) {
      return (VTable *)0x0;
    }
  }
  else {
    do {
      if (p_Var12[1]._M_next == (_List_node_base *)table) {
        return (VTable *)(p_Var12 + 1);
      }
      p_Var12 = (((_List_base<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>
                   *)&p_Var12->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var12 != __position);
    if (p_Var2 == __position) goto LAB_00308492;
  }
  uVar15 = (ulong)*(ushort *)(table + (4 - (long)*(int *)table));
  local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_708,table + (ulong)*(uint *)(table + uVar15) + 4 + uVar15,
             table + (ulong)*(uint *)(table + (ulong)*(uint *)(table + uVar15) + 4 + uVar15 + -4) +
                     *(uint *)(table + uVar15) + uVar15 + 4);
  uVar13 = local_7b0;
  local_5d8 = OK;
  local_5d0 = &local_5c0;
  local_5c8 = 0;
  local_5c0 = 0;
  local_5a8 = &local_598;
  local_5a0 = 0;
  local_598 = 0;
  local_588 = &local_578;
  local_580 = 0;
  local_578 = 0;
  local_568 = 0;
  local_5b0 = VTableSize;
  uVar15 = this->binary_length_;
  local_7b8 = this;
  if (uVar15 < 3 || uVar15 <= local_7b0 + 1) {
    uVar13 = 0;
    if (local_7b0 <= uVar15) {
      uVar13 = uVar15 - local_7b0;
    }
    local_378[0] = local_368;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"2","");
    local_5d8 = ERROR_INCOMPLETE_BINARY;
    std::__cxx11::string::_M_assign((string *)&local_5d0);
    if (local_378[0] != local_368) {
      operator_delete(local_378[0],local_368[0] + 1);
    }
    offset = local_7b0;
    local_c0._0_4_ = local_5d8;
    local_b8._M_p = (pointer)&local_a8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_5d0,local_5d0 + local_5c8);
    local_98 = local_5b0;
    local_90._M_p = (pointer)&local_80;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_5a8,local_5a8 + local_5a0);
    local_70._M_p = (pointer)&local_60;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_588,local_588 + local_580);
    local_50 = local_568;
    anon_unknown_49::MakeBinaryRegion
              ((BinaryRegion *)local_7a8,offset,uVar13,Unknown,uVar13,0,
               (BinaryRegionComment *)local_c0);
    anon_unknown_49::MakeSingleRegionBinarySection
              ((BinarySection *)local_6c8,&local_708,VTable,(BinaryRegion *)local_7a8);
    AddSection(local_7b8,offset,(BinarySection *)local_6c8);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              (&local_6a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) != &local_6b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_),
                      local_6b8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_730._M_p != &local_720) {
      operator_delete(local_730._M_p,local_720._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_750._M_p != &local_740) {
      operator_delete(local_750._M_p,local_740._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_778._M_p != &local_768) {
      operator_delete(local_778._M_p,local_768._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != &local_80) {
      operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
    }
    _Var18._M_p = local_b8._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &local_a8) {
LAB_00308c73:
      operator_delete(_Var18._M_p,local_a8._M_allocated_capacity + 1);
    }
  }
  else {
    local_7bc = *(ushort *)(this->binary_ + local_7b0);
    if ((local_7bc + local_7b0) - 1 < uVar15) {
      if (3 < local_7bc) {
        local_6e8.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_6e8.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_6e8.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a0._0_4_ = OK;
        local_298._M_p = (pointer)&local_288;
        std::__cxx11::string::_M_construct<char*>((string *)&local_298,local_5d0,local_5d0);
        local_278 = local_5b0;
        local_270._M_p = (pointer)&local_260;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_270,local_5a8,local_5a8 + local_5a0);
        local_250._M_p = (pointer)&local_240;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_250,local_588,local_588 + local_580);
        local_230 = local_568;
        anon_unknown_49::MakeBinaryRegion
                  ((BinaryRegion *)local_7a8,uVar13,2,Uint16,0,0,(BinaryRegionComment *)local_2a0);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
        emplace_back<flatbuffers::BinaryRegion>(&local_6e8,(BinaryRegion *)local_7a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_730._M_p != &local_720) {
          operator_delete(local_730._M_p,local_720._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_750._M_p != &local_740) {
          operator_delete(local_750._M_p,local_740._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_778._M_p != &local_768) {
          operator_delete(local_778._M_p,local_768._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_p != &local_240) {
          operator_delete(local_250._M_p,local_240._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_p != &local_260) {
          operator_delete(local_270._M_p,local_260._M_allocated_capacity + 1);
        }
        pBVar4 = local_7b8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_p != &local_288) {
          operator_delete(local_298._M_p,local_288._M_allocated_capacity + 1);
        }
        uVar13 = local_7b0;
        uVar15 = local_7b0 + 2;
        local_6c8._0_4_ = OK;
        local_6c0 = local_6b8._M_local_buf + 8;
        local_6b8._M_allocated_capacity = 0;
        local_6b8._M_local_buf[8] = '\0';
        local_6a0.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)local_688;
        local_6a0.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_688[0] = 0;
        local_688._16_8_ = &local_668;
        local_670 = 0;
        local_668 = 0;
        local_658._M_p = (pointer)0x0;
        local_6a0.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = VTableRefferingTableLength;
        uVar20 = pBVar4->binary_length_;
        if (uVar20 < 3 || uVar20 <= local_7b0 + 3) {
          uVar13 = 0;
          if (uVar15 <= uVar20) {
            uVar13 = uVar20 - uVar15;
          }
          local_3d8[0] = local_3c8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"2","");
          local_6c8._0_4_ = ERROR_INCOMPLETE_BINARY;
          std::__cxx11::string::_M_assign((string *)&local_6c0);
          if (local_3d8[0] != local_3c8) {
            operator_delete(local_3d8[0],local_3c8[0] + 1);
          }
          local_228._0_4_ = local_6c8._0_4_;
          local_220._M_p = (pointer)&local_210;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_220,local_6c0,local_6c0 + local_6b8._M_allocated_capacity);
          local_200 = (BinaryRegionCommentType)
                      local_6a0.
                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          local_1f8._M_p = (pointer)&local_1e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1f8,
                     local_6a0.
                     super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (undefined1 *)
                     ((long)&(local_6a0.
                              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->offset +
                     (long)&(local_6a0.
                             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->offset));
          local_1d8._M_p = (pointer)&local_1c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d8,local_688._16_8_,
                     (undefined1 *)(local_688._16_8_ + local_670));
          local_1b8 = local_658._M_p;
          anon_unknown_49::MakeBinaryRegion
                    ((BinaryRegion *)local_7a8,uVar15,uVar13,Unknown,uVar13,0,
                     (BinaryRegionComment *)local_228);
          anon_unknown_49::MakeSingleRegionBinarySection
                    ((BinarySection *)local_650,&local_708,VTable,(BinaryRegion *)local_7a8);
          AddSection(local_7b8,uVar15,(BinarySection *)local_650);
          std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
          ~vector((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                  local_628);
          if ((undefined1 *)CONCAT44(local_650._4_4_,local_650._0_4_) != local_648 + 8) {
            operator_delete((undefined1 *)CONCAT44(local_650._4_4_,local_650._0_4_),
                            local_648._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_730._M_p != &local_720) {
            operator_delete(local_730._M_p,local_720._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_750._M_p != &local_740) {
            operator_delete(local_750._M_p,local_740._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_778._M_p != &local_768) {
            operator_delete(local_778._M_p,local_768._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_p != &local_1c8) {
            operator_delete(local_1d8._M_p,local_1c8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_p != &local_1e8) {
            operator_delete(local_1f8._M_p,local_1e8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_p != &local_210) {
            operator_delete(local_220._M_p,local_210._M_allocated_capacity + 1);
          }
          pVVar14 = (VTable *)0x0;
        }
        else {
          uVar1 = *(ushort *)(pBVar4->binary_ + uVar15);
          local_4f8 = (ulong)uVar1;
          if ((local_550 + local_4f8) - 1 < uVar20) {
            if (uVar1 < 4) {
              plVar19 = local_348;
              local_358[0] = plVar19;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"4","");
              local_6c8._0_4_ = ERROR_LENGTH_TOO_SHORT;
              std::__cxx11::string::_M_assign((string *)&local_6c0);
              plVar17 = local_358[0];
              goto LAB_0030926a;
            }
          }
          else {
            plVar19 = local_328;
            local_338[0] = plVar19;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"");
            local_6c8._0_4_ = ERROR_LENGTH_TOO_LONG;
            std::__cxx11::string::_M_assign((string *)&local_6c0);
            plVar17 = local_338[0];
LAB_0030926a:
            if (plVar17 != plVar19) {
              operator_delete(plVar17,*plVar19 + 1);
            }
          }
          local_318._0_4_ = local_6c8._0_4_;
          local_310._M_p = (pointer)&local_300;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_310,local_6c0,local_6c0 + local_6b8._M_allocated_capacity);
          local_2f0 = (BinaryRegionCommentType)
                      local_6a0.
                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          local_2e8._M_p = (pointer)&local_2d8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2e8,
                     local_6a0.
                     super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (undefined1 *)
                     ((long)&(local_6a0.
                              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->offset +
                     (long)&(local_6a0.
                             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->offset));
          local_2c8._M_p = (pointer)&local_2b8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2c8,local_688._16_8_,
                     (undefined1 *)(local_688._16_8_ + local_670));
          local_2a8 = local_658._M_p;
          anon_unknown_49::MakeBinaryRegion
                    ((BinaryRegion *)local_7a8,uVar15,2,Uint16,0,0,(BinaryRegionComment *)local_318)
          ;
          std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
          emplace_back<flatbuffers::BinaryRegion>(&local_6e8,(BinaryRegion *)local_7a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_730._M_p != &local_720) {
            operator_delete(local_730._M_p,local_720._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_750._M_p != &local_740) {
            operator_delete(local_750._M_p,local_740._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_778._M_p != &local_768) {
            operator_delete(local_778._M_p,local_768._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_p != &local_2b8) {
            operator_delete(local_2c8._M_p,local_2b8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_p != &local_2d8) {
            operator_delete(local_2e8._M_p,local_2d8._M_allocated_capacity + 1);
          }
          pBVar4 = local_7b8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_p != &local_300) {
            operator_delete(local_310._M_p,local_300._M_allocated_capacity + 1);
          }
          local_558 = uVar13 + 4;
          local_530 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_548 + 8);
          local_548._8_4_ = _S_red;
          local_538 = (_Base_ptr)0x0;
          local_520 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
          local_7ba = 0;
          local_3f8._M_unused._M_object = (void *)0x0;
          local_3f8._8_8_ = 0;
          local_3e8 = (code *)0x0;
          pcStack_3e0 = (code *)0x0;
          paStack_528 = local_530;
          local_3f8._M_unused._M_object = operator_new(0x40);
          *(long **)local_3f8._M_unused._0_8_ = &local_558;
          *(uint64_t **)((long)local_3f8._M_unused._0_8_ + 8) = &local_7b0;
          *(ushort **)((long)local_3f8._M_unused._0_8_ + 0x10) = &local_7bc;
          *(BinaryAnnotator **)((long)local_3f8._M_unused._0_8_ + 0x18) = pBVar4;
          *(vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> **)
           ((long)local_3f8._M_unused._0_8_ + 0x20) = &local_6e8;
          *(uint64_t **)((long)local_3f8._M_unused._0_8_ + 0x28) = &local_550;
          *(undefined1 **)((long)local_3f8._M_unused._0_8_ + 0x30) = local_548;
          *(ushort **)((long)local_3f8._M_unused._0_8_ + 0x38) = &local_7ba;
          pcStack_3e0 = std::
                        _Function_handler<void_(const_reflection::Field_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/binary_annotator.cpp:355:42)>
                        ::_M_invoke;
          local_3e8 = std::
                      _Function_handler<void_(const_reflection::Field_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/binary_annotator.cpp:355:42)>
                      ::_M_manager;
          ForAllFields(table,false,(function<void_(const_reflection::Field_*)> *)&local_3f8);
          if (local_3e8 != (code *)0x0) {
            (*local_3e8)(&local_3f8,&local_3f8,__destroy_functor);
          }
          uVar6 = local_7bc + 0x1fffc >> 1;
          uVar15 = (ulong)local_7ba;
          uVar8 = (uint)local_7ba + (uint)local_7ba * 2;
          if ((ushort)uVar8 < (ushort)uVar6) {
            uVar6 = uVar8;
          }
          if (local_7ba < (ushort)uVar6) {
            local_560 = &local_720;
            iVar9 = local_7ba - uVar6;
            uVar20 = (ulong)((uint)local_7ba * 2);
            do {
              local_648._0_8_ = local_638;
              uVar3 = local_7b8->binary_length_;
              bVar5 = uVar3 <= uVar20 + local_558 + 1;
              if (bVar5 || uVar3 < 3) {
                uVar10 = Unknown;
              }
              else {
                uVar10 = *(undefined2 *)(local_7b8->binary_ + uVar20 + local_558);
              }
              offset_00 = local_558 + uVar20;
              local_650._0_4_ = OK;
              local_648._8_8_ = 0;
              local_638[0] = Unknown;
              local_628._8_8_ = &local_610;
              local_628._16_8_ = 0;
              local_610 = 0;
              local_600._M_allocated_capacity = (size_type)&local_5f0;
              local_600._8_8_ = 0;
              local_5f0 = 0;
              local_628._0_4_ = VTableUnknownFieldOffset;
              local_6cc = iVar9;
              local_5e0 = uVar15;
              if (bVar5 || uVar3 < 3) {
                uVar13 = 0;
                if (offset_00 <= uVar3) {
                  uVar13 = uVar3 - offset_00;
                }
                local_518[0] = local_508;
                local_4f0 = uVar15;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"2","");
                local_650._0_4_ = ERROR_INCOMPLETE_BINARY;
                std::__cxx11::string::_M_assign((string *)local_648);
                if (local_518[0] != local_508) {
                  operator_delete(local_518[0],local_508[0] + 1);
                }
                local_470._0_4_ = local_650._0_4_;
                local_468._M_p = (pointer)&local_458;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_468,local_648._0_8_,
                           (undefined1 *)(local_648._8_8_ + local_648._0_8_));
                local_448 = local_628._0_4_;
                local_440._M_p = (pointer)&local_430;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_440,local_628._8_8_,
                           (undefined1 *)(local_628._16_8_ + local_628._8_8_));
                local_420._M_p = (pointer)&local_410;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_420,local_600._M_allocated_capacity,
                           (undefined1 *)(local_600._8_8_ + local_600._M_allocated_capacity));
                local_400 = local_5e0;
                anon_unknown_49::MakeBinaryRegion
                          ((BinaryRegion *)local_7a8,offset_00,uVar13,Unknown,uVar13,0,
                           (BinaryRegionComment *)local_470);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&local_6e8,(BinaryRegion *)local_7a8);
                uVar15 = local_4f0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_730._M_p != local_560) {
                  operator_delete(local_730._M_p,local_720._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_750._M_p != &local_740) {
                  operator_delete(local_750._M_p,local_740._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_778._M_p != &local_768) {
                  operator_delete(local_778._M_p,local_768._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_420._M_p != &local_410) {
                  operator_delete(local_420._M_p,local_410._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_p != &local_430) {
                  operator_delete(local_440._M_p,local_430._M_allocated_capacity + 1);
                }
                uVar16 = local_458._M_allocated_capacity;
                _Var18._M_p = local_468._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_468._M_p != &local_458) goto LAB_00309a5f;
              }
              else {
                local_7a8._0_2_ = (short)uVar15;
                local_7a8._8_8_ = (Field *)0x0;
                local_798._M_allocated_capacity._0_2_ = uVar10;
                std::
                _Rb_tree<unsigned_short,std::pair<unsigned_short_const,flatbuffers::BinaryAnnotator::VTable::Entry>,std::_Select1st<std::pair<unsigned_short_const,flatbuffers::BinaryAnnotator::VTable::Entry>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,flatbuffers::BinaryAnnotator::VTable::Entry>>>
                ::
                _M_emplace_unique<std::pair<unsigned_short,flatbuffers::BinaryAnnotator::VTable::Entry>>
                          ((_Rb_tree<unsigned_short,std::pair<unsigned_short_const,flatbuffers::BinaryAnnotator::VTable::Entry>,std::_Select1st<std::pair<unsigned_short_const,flatbuffers::BinaryAnnotator::VTable::Entry>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,flatbuffers::BinaryAnnotator::VTable::Entry>>>
                            *)local_548,
                           (pair<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry> *)
                           local_7a8);
                local_4e8._0_4_ = local_650._0_4_;
                local_4e0._M_p = (pointer)&local_4d0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_4e0,local_648._0_8_,
                           (undefined1 *)(local_648._8_8_ + local_648._0_8_));
                local_4c0 = local_628._0_4_;
                local_4b8._M_allocated_capacity = (size_type)&local_4a8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_4b8,local_628._8_8_,
                           (undefined1 *)(local_628._16_8_ + local_628._8_8_));
                local_498._M_p = (pointer)&local_488;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_498,local_600._M_allocated_capacity,
                           (undefined1 *)(local_600._8_8_ + local_600._M_allocated_capacity));
                local_478 = local_5e0;
                anon_unknown_49::MakeBinaryRegion
                          ((BinaryRegion *)local_7a8,offset_00,2,VOffset,0,0,
                           (BinaryRegionComment *)local_4e8);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&local_6e8,(BinaryRegion *)local_7a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_730._M_p != local_560) {
                  operator_delete(local_730._M_p,local_720._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_750._M_p != &local_740) {
                  operator_delete(local_750._M_p,local_740._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_778._M_p != &local_768) {
                  operator_delete(local_778._M_p,local_768._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_498._M_p != &local_488) {
                  operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4b8._M_allocated_capacity != &local_4a8) {
                  operator_delete((void *)local_4b8._M_allocated_capacity,
                                  local_4a8._M_allocated_capacity + 1);
                }
                uVar16 = local_4d0._M_allocated_capacity;
                _Var18._M_p = local_4e0._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4e0._M_p != &local_4d0) {
LAB_00309a5f:
                  operator_delete(_Var18._M_p,uVar16 + 1);
                }
              }
              if ((undefined1 *)local_600._M_allocated_capacity != &local_5f0) {
                operator_delete((void *)local_600._M_allocated_capacity,
                                CONCAT71(uStack_5ef,local_5f0) + 1);
              }
              if ((undefined1 *)local_628._8_8_ != &local_610) {
                operator_delete((void *)local_628._8_8_,CONCAT71(uStack_60f,local_610) + 1);
              }
              iVar9 = local_6cc;
              if ((undefined1 *)local_648._0_8_ != local_638) {
                operator_delete((void *)local_648._0_8_,CONCAT71(local_638._1_7_,local_638[0]) + 1);
              }
              uVar15 = uVar15 + 1;
              uVar20 = uVar20 + 2;
              sVar11 = (short)iVar9 + 1;
              iVar9 = CONCAT22((short)((uint)iVar9 >> 0x10),sVar11);
            } while (sVar11 != 0);
          }
          if (__position->_M_next == __position) {
            local_48.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_6e8.
                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_48.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_6e8.
                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_48.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_6e8.
                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_6e8.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_6e8.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_6e8.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            anon_unknown_49::MakeBinarySection
                      ((BinarySection *)local_7a8,&local_708,VTable,&local_48);
            pmVar7 = std::
                     map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
                     ::operator[](&local_7b8->sections_,&local_7b0);
            BinarySection::operator=(pmVar7,(BinarySection *)local_7a8);
            BinarySection::~BinarySection((BinarySection *)local_7a8);
            std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
            ~vector(&local_48);
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_7a8,", ",&local_708);
            pmVar7 = std::
                     map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
                     ::operator[](&local_7b8->sections_,&local_7b0);
            std::__cxx11::string::_M_append((char *)pmVar7,local_7a8._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7a8._0_8_ != &local_798) {
              operator_delete((void *)local_7a8._0_8_,
                              CONCAT44(local_798._M_allocated_capacity._4_4_,
                                       CONCAT22(local_798._M_allocated_capacity._2_2_,
                                                local_798._M_allocated_capacity._0_2_)) + 1);
            }
          }
          local_798._M_allocated_capacity._0_2_ = Unknown;
          local_798._M_allocated_capacity._2_2_ = Unknown >> 0x10;
          local_798._8_8_ = 0;
          local_778._M_p = (pointer)0x0;
          local_770._0_2_ = 0;
          local_770._2_2_ = 0;
          local_7a8._0_8_ = table;
          local_788 = &local_798;
          paStack_780 = &local_798;
          std::
          _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
          ::clear((_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                   *)(local_7a8 + 8));
          if (local_538 != (_Base_ptr)0x0) {
            local_798._M_allocated_capacity._0_2_ = (undefined2)local_548._8_4_;
            local_798._M_allocated_capacity._2_2_ = SUB42(local_548._8_4_,2);
            local_798._8_8_ = local_538;
            local_788 = local_530;
            paStack_780 = paStack_528;
            local_538->_M_parent = (_Base_ptr)&local_798;
            local_778._M_p = (pointer)local_520;
            local_538 = (_Base_ptr)0x0;
            local_530 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_548 + 8);
            local_520 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
            paStack_528 = local_530;
          }
          local_770._2_2_ = (uint16_t)local_4f8;
          local_770._0_2_ = local_7bc;
          std::__cxx11::
          list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>
          ::_M_insert<flatbuffers::BinaryAnnotator::VTable>
                    ((list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>
                      *)__position,(iterator)__position,(VTable *)local_7a8);
          pVVar14 = (VTable *)(__position->_M_prev + 1);
          std::
          _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
          ::~_Rb_tree((_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                       *)(local_7a8 + 8));
          std::
          _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
          ::~_Rb_tree((_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                       *)local_548);
        }
        if ((undefined1 *)local_688._16_8_ != &local_668) {
          operator_delete((void *)local_688._16_8_,CONCAT71(uStack_667,local_668) + 1);
        }
        if (local_6a0.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)local_688) {
          operator_delete(local_6a0.
                          super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          CONCAT71(local_688._1_7_,local_688[0]) + 1);
        }
        if (local_6c0 != local_6b8._M_local_buf + 8) {
          operator_delete(local_6c0,CONCAT71(local_6b8._9_7_,local_6b8._M_local_buf[8]) + 1);
        }
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                  (&local_6e8);
        goto LAB_00308c85;
      }
      local_3b8[0] = local_3a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"4","");
      local_5d8 = ERROR_LENGTH_TOO_SHORT;
      std::__cxx11::string::_M_assign((string *)&local_5d0);
      if (local_3b8[0] != local_3a8) {
        operator_delete(local_3b8[0],local_3a8[0] + 1);
      }
      uVar13 = local_7b0;
      local_1b0._0_4_ = local_5d8;
      local_1a8._M_p = (pointer)&local_198;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a8,local_5d0,local_5d0 + local_5c8);
      local_188 = local_5b0;
      local_180._M_p = (pointer)&local_170;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_180,local_5a8,local_5a8 + local_5a0);
      local_160._M_p = (pointer)&local_150;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,local_588,local_588 + local_580);
      local_140 = local_568;
      anon_unknown_49::MakeBinaryRegion
                ((BinaryRegion *)local_7a8,uVar13,2,Uint16,0,0,(BinaryRegionComment *)local_1b0);
      anon_unknown_49::MakeSingleRegionBinarySection
                ((BinarySection *)local_6c8,&local_708,VTable,(BinaryRegion *)local_7a8);
      AddSection(local_7b8,uVar13,(BinarySection *)local_6c8);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                (&local_6a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) != &local_6b8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_),
                        local_6b8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_730._M_p != &local_720) {
        operator_delete(local_730._M_p,local_720._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_750._M_p != &local_740) {
        operator_delete(local_750._M_p,local_740._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_778._M_p != &local_768) {
        operator_delete(local_778._M_p,local_768._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_p != &local_150) {
        operator_delete(local_160._M_p,local_150._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_p != &local_170) {
        operator_delete(local_180._M_p,local_170._M_allocated_capacity + 1);
      }
      local_a8._M_allocated_capacity = local_198._M_allocated_capacity;
      _Var18._M_p = local_1a8._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_p != &local_198) goto LAB_00308c73;
    }
    else {
      local_398[0] = local_388;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"");
      local_5d8 = ERROR_LENGTH_TOO_LONG;
      std::__cxx11::string::_M_assign((string *)&local_5d0);
      if (local_398[0] != local_388) {
        operator_delete(local_398[0],local_388[0] + 1);
      }
      uVar13 = local_7b0;
      local_138._0_4_ = local_5d8;
      local_130._M_p = (pointer)&local_120;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,local_5d0,local_5d0 + local_5c8);
      local_110 = local_5b0;
      local_108._M_p = (pointer)&local_f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,local_5a8,local_5a8 + local_5a0);
      local_e8._M_p = (pointer)&local_d8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_588,local_588 + local_580)
      ;
      local_c8 = local_568;
      anon_unknown_49::MakeBinaryRegion
                ((BinaryRegion *)local_7a8,uVar13,2,Uint16,0,0,(BinaryRegionComment *)local_138);
      anon_unknown_49::MakeSingleRegionBinarySection
                ((BinarySection *)local_6c8,&local_708,VTable,(BinaryRegion *)local_7a8);
      AddSection(local_7b8,uVar13,(BinarySection *)local_6c8);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                (&local_6a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_) != &local_6b8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_6c8._4_4_,local_6c8._0_4_),
                        local_6b8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_730._M_p != &local_720) {
        operator_delete(local_730._M_p,local_720._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_750._M_p != &local_740) {
        operator_delete(local_750._M_p,local_740._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_778._M_p != &local_768) {
        operator_delete(local_778._M_p,local_768._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_p != &local_d8) {
        operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
        operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
      }
      local_a8._M_allocated_capacity = local_120._M_allocated_capacity;
      _Var18._M_p = local_130._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_p != &local_120) goto LAB_00308c73;
    }
  }
  pVVar14 = (VTable *)0x0;
LAB_00308c85:
  if (local_588 != &local_578) {
    operator_delete(local_588,CONCAT71(uStack_577,local_578) + 1);
  }
  if (local_5a8 != &local_598) {
    operator_delete(local_5a8,CONCAT71(uStack_597,local_598) + 1);
  }
  if (local_5d0 != &local_5c0) {
    operator_delete(local_5d0,CONCAT71(uStack_5bf,local_5c0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708._M_dataplus._M_p != &local_708.field_2) {
    operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
  }
  return pVVar14;
}

Assistant:

BinaryAnnotator::VTable *BinaryAnnotator::GetOrBuildVTable(
    const uint64_t vtable_offset, const reflection::Object *const table,
    const uint64_t offset_of_referring_table) {
  // Get a list of vtables (if any) already defined at this offset.
  std::list<VTable> &vtables = vtables_[vtable_offset];

  // See if this vtable for the table type has been generated before.
  for (VTable &vtable : vtables) {
    if (vtable.referring_table == table) { return &vtable; }
  }

  // If we are trying to make a new vtable and it is already encompassed by
  // another binary section, something is corrupted.
  if (vtables.empty() && ContainsSection(vtable_offset)) { return nullptr; }

  const std::string referring_table_name = table->name()->str();

  BinaryRegionComment vtable_size_comment;
  vtable_size_comment.type = BinaryRegionCommentType::VTableSize;

  const auto vtable_length = ReadScalar<uint16_t>(vtable_offset);
  if (!vtable_length.has_value()) {
    const uint64_t remaining = RemainingBytes(vtable_offset);

    SetError(vtable_size_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
             "2");

    AddSection(vtable_offset,
               MakeSingleRegionBinarySection(
                   referring_table_name, BinarySectionType::VTable,
                   MakeBinaryRegion(vtable_offset, remaining,
                                    BinaryRegionType::Unknown, remaining, 0,
                                    vtable_size_comment)));
    return nullptr;
  }

  // Vtables start with the size of the vtable
  const uint16_t vtable_size = vtable_length.value();

  if (!IsValidOffset(vtable_offset + vtable_size - 1)) {
    SetError(vtable_size_comment, BinaryRegionStatus::ERROR_LENGTH_TOO_LONG);
    // The vtable_size points to off the end of the binary.
    AddSection(vtable_offset,
               MakeSingleRegionBinarySection(
                   referring_table_name, BinarySectionType::VTable,
                   MakeBinaryRegion(vtable_offset, sizeof(uint16_t),
                                    BinaryRegionType::Uint16, 0, 0,
                                    vtable_size_comment)));

    return nullptr;
  } else if (vtable_size < 2 * sizeof(uint16_t)) {
    SetError(vtable_size_comment, BinaryRegionStatus::ERROR_LENGTH_TOO_SHORT,
             "4");
    // The size includes itself and the table size which are both uint16_t.
    AddSection(vtable_offset,
               MakeSingleRegionBinarySection(
                   referring_table_name, BinarySectionType::VTable,
                   MakeBinaryRegion(vtable_offset, sizeof(uint16_t),
                                    BinaryRegionType::Uint16, 0, 0,
                                    vtable_size_comment)));
    return nullptr;
  }

  std::vector<BinaryRegion> regions;

  regions.push_back(MakeBinaryRegion(vtable_offset, sizeof(uint16_t),
                                     BinaryRegionType::Uint16, 0, 0,
                                     vtable_size_comment));
  uint64_t offset = vtable_offset + sizeof(uint16_t);

  BinaryRegionComment ref_table_len_comment;
  ref_table_len_comment.type =
      BinaryRegionCommentType::VTableRefferingTableLength;

  // Ensure we can read the next uint16_t field, which is the size of the
  // referring table.
  const auto table_length = ReadScalar<uint16_t>(offset);

  if (!table_length.has_value()) {
    const uint64_t remaining = RemainingBytes(offset);
    SetError(ref_table_len_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
             "2");

    AddSection(offset, MakeSingleRegionBinarySection(
                           referring_table_name, BinarySectionType::VTable,
                           MakeBinaryRegion(
                               offset, remaining, BinaryRegionType::Unknown,
                               remaining, 0, ref_table_len_comment)));
    return nullptr;
  }

  // Then they have the size of the table they reference.
  const uint16_t table_size = table_length.value();

  if (!IsValidOffset(offset_of_referring_table + table_size - 1)) {
    SetError(ref_table_len_comment, BinaryRegionStatus::ERROR_LENGTH_TOO_LONG);
  } else if (table_size < 4) {
    SetError(ref_table_len_comment, BinaryRegionStatus::ERROR_LENGTH_TOO_SHORT,
             "4");
  }

  regions.push_back(MakeBinaryRegion(offset, sizeof(uint16_t),
                                     BinaryRegionType::Uint16, 0, 0,
                                     ref_table_len_comment));
  offset += sizeof(uint16_t);

  const uint64_t offset_start = offset;

  // A mapping between field (and its id) to the relative offset (uin16_t) from
  // the start of the table.
  std::map<uint16_t, VTable::Entry> fields;

  // Counter for determining if the binary has more vtable entries than the
  // schema provided. This can occur if the binary was created at a newer schema
  // version and is being processed with an older one.
  uint16_t fields_processed = 0;

  // Loop over all the fields.
  ForAllFields(table, /*reverse=*/false, [&](const reflection::Field *field) {
    const uint64_t field_offset = offset_start + field->id() * sizeof(uint16_t);

    if (field_offset >= vtable_offset + vtable_size) {
      // This field_offset is too large for this vtable, so it must come from a
      // newer schema than the binary was create with or the binary writer did
      // not write it. For either case, it is safe to ignore.

      // TODO(dbaileychess): We could show which fields are not set an their
      // default values if we want. We just need a way to make it obvious that
      // it isn't part of the buffer.
      return;
    }

    BinaryRegionComment field_comment;
    field_comment.type = BinaryRegionCommentType::VTableFieldOffset;
    field_comment.name = std::string(field->name()->c_str()) +
                         "` (id: " + std::to_string(field->id()) + ")";

    const auto offset_from_table = ReadScalar<uint16_t>(field_offset);

    if (!offset_from_table.has_value()) {
      const uint64_t remaining = RemainingBytes(field_offset);

      SetError(field_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "2");
      regions.push_back(MakeBinaryRegion(field_offset, remaining,
                                         BinaryRegionType::Unknown, remaining,
                                         0, field_comment));

      return;
    }

    if (!IsValidOffset(offset_of_referring_table + offset_from_table.value() -
                       1)) {
      SetError(field_comment, BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);
      regions.push_back(MakeBinaryRegion(field_offset, sizeof(uint16_t),
                                         BinaryRegionType::VOffset, 0, 0,
                                         field_comment));
      return;
    }

    VTable::Entry entry;
    entry.field = field;
    entry.offset_from_table = offset_from_table.value();
    fields.insert(std::make_pair(field->id(), entry));

    std::string default_label;
    if (offset_from_table.value() == 0) {
      // Not present, so could be default or be optional.
      if (field->required()) {
        SetError(field_comment,
                 BinaryRegionStatus::ERROR_REQUIRED_FIELD_NOT_PRESENT);
        // If this is a required field, make it known this is an error.
        regions.push_back(MakeBinaryRegion(field_offset, sizeof(uint16_t),
                                           BinaryRegionType::VOffset, 0, 0,
                                           field_comment));
        return;
      } else {
        // Its an optional field, so get the default value and interpret and
        // provided an annotation for it.
        if (IsScalar(field->type()->base_type())) {
          default_label += "<defaults to ";
          default_label += IsFloat(field->type()->base_type())
                               ? std::to_string(field->default_real())
                               : std::to_string(field->default_integer());
          default_label += "> (";
        } else {
          default_label += "<null> (";
        }
        default_label +=
            reflection::EnumNameBaseType(field->type()->base_type());
        default_label += ")";
      }
    }
    field_comment.default_value = default_label;

    regions.push_back(MakeBinaryRegion(field_offset, sizeof(uint16_t),
                                       BinaryRegionType::VOffset, 0, 0,
                                       field_comment));

    fields_processed++;
  });

  // Check if we covered all the expectant fields. If not, we need to add them
  // as unknown fields.
  uint16_t expectant_vtable_fields =
      (vtable_size - sizeof(uint16_t) - sizeof(uint16_t)) / sizeof(uint16_t);

  // Prevent a bad binary from declaring a really large vtable_size, that we can
  // not independently verify.
  expectant_vtable_fields = std::min(
      static_cast<uint16_t>(fields_processed * 3), expectant_vtable_fields);

  for (uint16_t id = fields_processed; id < expectant_vtable_fields; ++id) {
    const uint64_t field_offset = offset_start + id * sizeof(uint16_t);

    const auto offset_from_table = ReadScalar<uint16_t>(field_offset);

    BinaryRegionComment field_comment;
    field_comment.type = BinaryRegionCommentType::VTableUnknownFieldOffset;
    field_comment.index = id;

    if (!offset_from_table.has_value()) {
      const uint64_t remaining = RemainingBytes(field_offset);
      SetError(field_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "2");
      regions.push_back(MakeBinaryRegion(field_offset, remaining,
                                         BinaryRegionType::Unknown, remaining,
                                         0, field_comment));
      continue;
    }

    VTable::Entry entry;
    entry.field = nullptr;  // No field to reference.
    entry.offset_from_table = offset_from_table.value();
    fields.insert(std::make_pair(id, entry));

    regions.push_back(MakeBinaryRegion(field_offset, sizeof(uint16_t),
                                       BinaryRegionType::VOffset, 0, 0,
                                       field_comment));
  }

  // If we have never added this vtable before record the Binary section.
  if (vtables.empty()) {
    sections_[vtable_offset] = MakeBinarySection(
        referring_table_name, BinarySectionType::VTable, std::move(regions));
  } else {
    // Add the current table name to the name of the section.
    sections_[vtable_offset].name += ", " + referring_table_name;
  }

  VTable vtable;
  vtable.referring_table = table;
  vtable.fields = std::move(fields);
  vtable.table_size = table_size;
  vtable.vtable_size = vtable_size;

  // Add this vtable to the collection of vtables at this offset.
  vtables.push_back(std::move(vtable));

  // Return the vtable we just added.
  return &vtables.back();
}